

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kdtree.c
# Opt level: O2

int32 read_kd_nodes(FILE *fp,kd_tree_node_t *node,uint32 level)

{
  uint32 uVar1;
  int32 iVar2;
  uint uVar3;
  int iVar4;
  int32 iVar5;
  undefined8 in_RAX;
  uint8 *puVar6;
  kd_tree_node_t *pkVar7;
  int32 optional;
  char *fmt;
  long ln;
  ulong uVar8;
  ulong uVar9;
  int32 iVar10;
  undefined8 uStack_38;
  uint32 n;
  
  uStack_38 = in_RAX;
  iVar2 = read_tree_int(fp,"NODE",&n,0);
  iVar10 = -1;
  iVar5 = iVar10;
  if (-1 < iVar2) {
    uVar8 = (ulong)n;
    if (n == level) {
      optional = 0;
      iVar2 = read_tree_int(fp,"split_comp",&node->split_comp,0);
      if (((-1 < iVar2) &&
          (iVar2 = read_tree_float(fp,"split_plane",&node->split_plane,optional), -1 < iVar2)) &&
         (uVar3 = read_tree_int(fp,"bbi",&n,1), -1 < (int)uVar3)) {
        puVar6 = (uint8 *)__ckd_calloc__((ulong)node->n_density,1,
                                         "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libclust/kdtree.c"
                                         ,0x1ad);
        node->bbi = puVar6;
        if (1 < uVar3) {
          uVar8 = (ulong)n;
          if (node->n_density <= n) {
            err_msg(ERR_ERROR,
                    "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libclust/kdtree.c"
                    ,0x1b0,"BBI Gaussian %d out of range! %d\n");
            return -1;
          }
          while( true ) {
            puVar6[uVar8] = '\x01';
            uVar3 = __isoc99_fscanf(fp,"%d",&n);
            if ((uVar3 == 0) || (iVar4 = feof((FILE *)fp), iVar4 != 0)) break;
            uVar8 = (ulong)n;
            if (node->n_density <= n) {
              fmt = "BBI Gaussian %d out of range! %d\n";
              ln = 0x1b8;
              uVar9 = (ulong)uVar3;
              goto LAB_0010d0d6;
            }
            puVar6 = node->bbi;
          }
        }
        iVar5 = 0;
        if (level != 1) {
          pkVar7 = (kd_tree_node_t *)
                   __ckd_calloc__(1,0x58,
                                  "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libclust/kdtree.c"
                                  ,0x1c2);
          node->left = pkVar7;
          uVar1 = node->n_comp;
          pkVar7->n_density = node->n_density;
          pkVar7->n_comp = uVar1;
          iVar2 = read_kd_nodes(fp,pkVar7,level - 1);
          iVar5 = iVar10;
          if (-1 < iVar2) {
            pkVar7 = (kd_tree_node_t *)
                     __ckd_calloc__(1,0x58,
                                    "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libclust/kdtree.c"
                                    ,0x1c7);
            node->right = pkVar7;
            uVar1 = node->n_comp;
            pkVar7->n_density = node->n_density;
            pkVar7->n_comp = uVar1;
            iVar5 = read_kd_nodes(fp,pkVar7,level - 1);
          }
        }
      }
    }
    else {
      fmt = "Levels for node don\'t match (%d != %d)\n";
      ln = 0x1a4;
      uVar9 = (ulong)level;
LAB_0010d0d6:
      err_msg(ERR_ERROR,
              "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libclust/kdtree.c"
              ,ln,fmt,uVar8,uVar9);
    }
  }
  return iVar5;
}

Assistant:

int32
read_kd_nodes(FILE *fp, kd_tree_node_t *node, uint32 level)
{
	uint32 n;
	int i;

	if (read_tree_int(fp, "NODE", &n, FALSE) < 0)
		return -1;
	if (n != level) {
		E_ERROR("Levels for node don't match (%d != %d)\n", n, level);
		return -1;
	}
	if (read_tree_int(fp, "split_comp", &node->split_comp, FALSE) < 0)
		return -1;
	if (read_tree_float(fp, "split_plane", &node->split_plane, FALSE) < 0)
		return -1;
	if ((i = read_tree_int(fp, "bbi", &n, TRUE)) < 0)
		return -1;
	node->bbi = ckd_calloc(node->n_density, sizeof(*node->bbi));
	if (i > 1) {
		if (n >= node->n_density) {
			E_ERROR("BBI Gaussian %d out of range! %d\n", n);
			return -1;
		}
		node->bbi[n] = 1;
		while ((i = fscanf(fp, "%d", &n))) {
			if (feof(fp))
				break;
			if (n >= node->n_density) {
				E_ERROR("BBI Gaussian %d out of range! %d\n", n, i);
				return -1;
			}
			node->bbi[n] = 1;
		}
	}

	if (level == 1)
		return 0;

	node->left = ckd_calloc(1, sizeof(*node->left));
	node->left->n_density = node->n_density;
	node->left->n_comp = node->n_comp;
	if (read_kd_nodes(fp, node->left, level-1) < 0)
		return -1;
	node->right = ckd_calloc(1, sizeof(*node->left));
	node->right->n_density = node->n_density;
	node->right->n_comp = node->n_comp;
	if (read_kd_nodes(fp, node->right, level-1) < 0)
		return -1;
	return 0;
}